

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  int iVar1;
  _GLFWmapelement *p_Var2;
  void *in_RSI;
  uint in_EDI;
  float fVar3;
  uint bit_1;
  uint hat_1;
  float value_1;
  _GLFWmapelement *e_1;
  uint bit;
  uint hat;
  float value;
  _GLFWmapelement *e;
  _GLFWjoystick *js;
  int i;
  int in_stack_ffffffffffffffbc;
  _GLFWjoystick *in_stack_ffffffffffffffc0;
  int local_14;
  int local_4;
  
  memset(in_RSI,0,0x28);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else if (((int)in_EDI < 0) || (0xf < (int)in_EDI)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)in_EDI);
    local_4 = 0;
  }
  else if (_glfw.joysticks[(int)in_EDI].present == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = _glfwPlatformPollJoystick(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if (_glfw.joysticks[(int)in_EDI].mapping == (_GLFWmapping *)0x0) {
      local_4 = 0;
    }
    else {
      for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
        p_Var2 = (_glfw.joysticks[(int)in_EDI].mapping)->buttons + local_14;
        if (p_Var2->type == '\x01') {
          fVar3 = _glfw.joysticks[(int)in_EDI].axes[p_Var2->index] * (float)(int)p_Var2->axisScale +
                  (float)(int)p_Var2->axisOffset;
          if ((p_Var2->axisOffset < '\0') ||
             ((p_Var2->axisOffset == '\0' && ('\0' < p_Var2->axisScale)))) {
            if (0.0 <= fVar3) {
              *(undefined1 *)((long)in_RSI + (long)local_14) = 1;
            }
          }
          else if (fVar3 <= 0.0) {
            *(undefined1 *)((long)in_RSI + (long)local_14) = 1;
          }
        }
        else if (p_Var2->type == '\x03') {
          if ((_glfw.joysticks[(int)in_EDI].hats[(uint)((int)(uint)p_Var2->index >> 4)] &
              p_Var2->index & 0xf) != 0) {
            *(undefined1 *)((long)in_RSI + (long)local_14) = 1;
          }
        }
        else if (p_Var2->type == '\x02') {
          *(uchar *)((long)in_RSI + (long)local_14) =
               _glfw.joysticks[(int)in_EDI].buttons[p_Var2->index];
        }
      }
      for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
        p_Var2 = (_glfw.joysticks[(int)in_EDI].mapping)->axes + local_14;
        if (p_Var2->type == '\x01') {
          fVar3 = _glfw_fmaxf(_glfw.joysticks[(int)in_EDI].axes[p_Var2->index] *
                              (float)(int)p_Var2->axisScale + (float)(int)p_Var2->axisOffset,-1.0);
          fVar3 = _glfw_fminf(fVar3,1.0);
          *(float *)((long)in_RSI + (long)local_14 * 4 + 0x10) = fVar3;
        }
        else if (p_Var2->type == '\x03') {
          if ((_glfw.joysticks[(int)in_EDI].hats[(uint)((int)(uint)p_Var2->index >> 4)] &
              p_Var2->index & 0xf) == 0) {
            *(undefined4 *)((long)in_RSI + (long)local_14 * 4 + 0x10) = 0xbf800000;
          }
          else {
            *(undefined4 *)((long)in_RSI + (long)local_14 * 4 + 0x10) = 0x3f800000;
          }
        }
        else if (p_Var2->type == '\x02') {
          fVar3 = (float)_glfw.joysticks[(int)in_EDI].buttons[p_Var2->index];
          *(float *)((long)in_RSI + (long)local_14 * 4 + 0x10) = fVar3 + fVar3 + -1.0;
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->buttons + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            // HACK: This should be baked into the value transform
            // TODO: Bake into transform when implementing output modifiers
            if (e->axisOffset < 0 || (e->axisOffset == 0 && e->axisScale > 0))
            {
                if (value >= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
            else
            {
                if (value <= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[e->index];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->axes + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            state->axes[i] = _glfw_fminf(_glfw_fmaxf(value, -1.f), 1.f);
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
            else
                state->axes[i] = -1.f;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = js->buttons[e->index] * 2.f - 1.f;
    }

    return GLFW_TRUE;
}